

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

void intern_blocks(opt_state_t *opt_state,icode *ic)

{
  block *pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  block *local_38;
  int local_28;
  int done1;
  int j;
  int i;
  block *p;
  icode *ic_local;
  opt_state_t *opt_state_local;
  
  do {
    bVar2 = true;
    for (done1 = 0; done1 < opt_state->n_blocks; done1 = done1 + 1) {
      opt_state->blocks[done1]->link = (block *)0x0;
    }
    mark_code(ic);
    iVar3 = opt_state->n_blocks + -1;
LAB_001181c6:
    done1 = iVar3;
    iVar3 = done1 + -1;
    if (-1 < iVar3) {
      if (opt_state->blocks[iVar3]->mark == ic->cur_mark) {
        for (local_28 = done1; local_28 < opt_state->n_blocks; local_28 = local_28 + 1) {
          if ((opt_state->blocks[local_28]->mark == ic->cur_mark) &&
             (iVar4 = eq_blk(opt_state->blocks[iVar3],opt_state->blocks[local_28]), iVar4 != 0)) {
            if (opt_state->blocks[local_28]->link == (block *)0x0) {
              local_38 = opt_state->blocks[local_28];
            }
            else {
              local_38 = opt_state->blocks[local_28]->link;
            }
            opt_state->blocks[iVar3]->link = local_38;
            break;
          }
        }
      }
      goto LAB_001181c6;
    }
    for (done1 = 0; done1 < opt_state->n_blocks; done1 = done1 + 1) {
      pbVar1 = opt_state->blocks[done1];
      if ((pbVar1->et).succ != (block *)0x0) {
        if (((pbVar1->et).succ)->link != (block *)0x0) {
          bVar2 = false;
          (pbVar1->et).succ = ((pbVar1->et).succ)->link;
        }
        if (((pbVar1->ef).succ)->link != (block *)0x0) {
          bVar2 = false;
          (pbVar1->ef).succ = ((pbVar1->ef).succ)->link;
        }
      }
    }
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

static void
intern_blocks(opt_state_t *opt_state, struct icode *ic)
{
	struct block *p;
	int i, j;
	int done1; /* don't shadow global */
 top:
	done1 = 1;
	for (i = 0; i < opt_state->n_blocks; ++i)
		opt_state->blocks[i]->link = 0;

	mark_code(ic);

	for (i = opt_state->n_blocks - 1; --i >= 0; ) {
		if (!isMarked(ic, opt_state->blocks[i]))
			continue;
		for (j = i + 1; j < opt_state->n_blocks; ++j) {
			if (!isMarked(ic, opt_state->blocks[j]))
				continue;
			if (eq_blk(opt_state->blocks[i], opt_state->blocks[j])) {
				opt_state->blocks[i]->link = opt_state->blocks[j]->link ?
					opt_state->blocks[j]->link : opt_state->blocks[j];
				break;
			}
		}
	}
	for (i = 0; i < opt_state->n_blocks; ++i) {
		p = opt_state->blocks[i];
		if (JT(p) == 0)
			continue;
		if (JT(p)->link) {
			done1 = 0;
			JT(p) = JT(p)->link;
		}
		if (JF(p)->link) {
			done1 = 0;
			JF(p) = JF(p)->link;
		}
	}
	if (!done1)
		goto top;
}